

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateCatIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Con)

{
  int iVar1;
  uint i_00;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vSigs;
  int nBits;
  int NameId;
  int iFon;
  int iObj;
  int Sig;
  int i;
  int Con_local;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  vSigs._4_4_ = 0;
  p_00 = Prs_CatSignals(pNtk,Con);
  iVar1 = Vec_IntSize(p_00);
  i_00 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,iVar1,1);
  iVar1 = Cba_ObjFon0(p,i_00);
  iVar2 = Cba_NtkNewStrId(p,"_icc%d_",(ulong)i_00);
  Cba_FonSetName(p,iVar1,iVar2);
  Cba_NtkSetMap(p,iVar2,iVar1);
  for (iObj = 0; iVar1 = Vec_IntSize(p_00), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_00,iObj);
    iVar1 = Prs_CreateSignalIn(p,pNtk,iVar1);
    if (iVar1 != 0) {
      Cba_ObjSetFinFon(p,i_00,iObj,iVar1);
      iVar1 = Cba_FonRangeSize(p,iVar1);
      vSigs._4_4_ = iVar1 + vSigs._4_4_;
    }
  }
  iVar1 = Cba_ObjFon0(p,i_00);
  iVar2 = Cba_NtkHashRange(p,vSigs._4_4_ + -1,0);
  Cba_FonSetRange(p,iVar1,iVar2);
  iVar1 = Cba_ObjFon0(p,i_00);
  return iVar1;
}

Assistant:

int Prs_CreateCatIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Con )
{
    extern int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig );
    int i, Sig, iObj, iFon, NameId, nBits = 0;
    Vec_Int_t * vSigs = Prs_CatSignals(pNtk, Con);
    // create input concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, Vec_IntSize(vSigs), 1 );
    iFon = Cba_ObjFon0(p, iObj);
    //sprintf( Buffer, "_icc%d_", iObj );
    //NameId = Cba_NtkNewStrId( p, Buffer );
    NameId = Cba_NtkNewStrId( p, "_icc%d_", iObj );
    Cba_FonSetName( p, iFon, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    // set inputs
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        iFon = Prs_CreateSignalIn( p, pNtk, Sig );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, i, iFon );
        if ( iFon )
            nBits += Cba_FonRangeSize( p, iFon );
    }
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, nBits-1, 0) );
    return Cba_ObjFon0(p, iObj);
}